

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::ObjectIntersectorK<4,_true>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  AABBNodeMB4D *node1;
  ulong uVar8;
  ulong uVar9;
  RTCIntersectFunctionN p_Var10;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar11;
  uint uVar12;
  size_t sVar13;
  NodeRef *pNVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar29;
  float fVar30;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar31;
  undefined1 auVar27 [16];
  vint4 ai_2;
  undefined1 auVar32 [16];
  vint4 ai_1;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 ai_3;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  vint4 bi;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vint4 bi_1;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 bi_3;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  vint4 ai;
  undefined1 auVar49 [16];
  vint4 bi_2;
  undefined1 in_ZMM10 [64];
  undefined1 auVar50 [64];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_17f8;
  RTCIntersectFunctionNArguments local_17d0;
  Geometry *local_17a0;
  undefined8 local_1798;
  RTCIntersectArguments *local_1790;
  undefined1 local_1788 [16];
  undefined1 local_1778 [16];
  undefined1 local_1768 [16];
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1728;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar28 [64];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    auVar27 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar17 = vpcmpeqd_avx(auVar27,(undefined1  [16])valid_i->field_0);
    auVar19 = ZEXT816(0) << 0x40;
    auVar27 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar19,5);
    auVar26 = auVar17 & auVar27;
    if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar26[0xf] < '\0')
    {
      local_1788 = vandps_avx(auVar27,auVar17);
      auVar18 = vpcmpeqd_avx(in_ZMM10._0_16_,in_ZMM10._0_16_);
      local_16f8 = *(undefined8 *)ray;
      uStack_16f0 = *(undefined8 *)(ray + 8);
      local_1708 = *(undefined8 *)(ray + 0x10);
      uStack_1700 = *(undefined8 *)(ray + 0x18);
      local_1718 = *(undefined8 *)(ray + 0x20);
      uStack_1710 = *(undefined8 *)(ray + 0x28);
      auVar24._8_4_ = 0x7fffffff;
      auVar24._0_8_ = 0x7fffffff7fffffff;
      auVar24._12_4_ = 0x7fffffff;
      auVar27 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar24);
      auVar33._8_4_ = 0x219392ef;
      auVar33._0_8_ = 0x219392ef219392ef;
      auVar33._12_4_ = 0x219392ef;
      auVar27 = vcmpps_avx(auVar27,auVar33,1);
      auVar17 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar33,auVar27);
      auVar27 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar24);
      auVar27 = vcmpps_avx(auVar27,auVar33,1);
      auVar26 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar33,auVar27);
      auVar27 = vrcpps_avx(auVar17);
      local_1748 = auVar27._0_4_;
      auVar21._0_4_ = auVar17._0_4_ * local_1748;
      fStack_1744 = auVar27._4_4_;
      auVar21._4_4_ = auVar17._4_4_ * fStack_1744;
      fStack_1740 = auVar27._8_4_;
      auVar21._8_4_ = auVar17._8_4_ * fStack_1740;
      fStack_173c = auVar27._12_4_;
      auVar21._12_4_ = auVar17._12_4_ * fStack_173c;
      auVar46._8_4_ = 0x3f800000;
      auVar46._0_8_ = &DAT_3f8000003f800000;
      auVar46._12_4_ = 0x3f800000;
      auVar21 = vsubps_avx(auVar46,auVar21);
      auVar27 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar24);
      auVar27 = vcmpps_avx(auVar27,auVar33,1);
      auVar27 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar33,auVar27);
      auVar17 = vrcpps_avx(auVar26);
      local_1758 = auVar17._0_4_;
      auVar37._0_4_ = auVar26._0_4_ * local_1758;
      fStack_1754 = auVar17._4_4_;
      auVar37._4_4_ = auVar26._4_4_ * fStack_1754;
      fStack_1750 = auVar17._8_4_;
      auVar37._8_4_ = auVar26._8_4_ * fStack_1750;
      fStack_174c = auVar17._12_4_;
      auVar37._12_4_ = auVar26._12_4_ * fStack_174c;
      auVar24 = vsubps_avx(auVar46,auVar37);
      auVar17 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar19);
      auVar26 = vrcpps_avx(auVar27);
      local_1738 = auVar26._0_4_;
      auVar25._0_4_ = auVar27._0_4_ * local_1738;
      fStack_1734 = auVar26._4_4_;
      auVar25._4_4_ = auVar27._4_4_ * fStack_1734;
      fStack_1730 = auVar26._8_4_;
      auVar25._8_4_ = auVar27._8_4_ * fStack_1730;
      fStack_172c = auVar26._12_4_;
      auVar25._12_4_ = auVar27._12_4_ * fStack_172c;
      auVar27 = vsubps_avx(auVar46,auVar25);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      local_1728.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar17,local_1788);
      local_1738 = local_1738 + local_1738 * auVar27._0_4_;
      fStack_1734 = fStack_1734 + fStack_1734 * auVar27._4_4_;
      fStack_1730 = fStack_1730 + fStack_1730 * auVar27._8_4_;
      fStack_172c = fStack_172c + fStack_172c * auVar27._12_4_;
      auVar26._0_4_ = local_1788._0_4_ ^ auVar18._0_4_;
      auVar26._4_4_ = local_1788._4_4_ ^ auVar18._4_4_;
      auVar26._8_4_ = local_1788._8_4_ ^ auVar18._8_4_;
      auVar26._12_4_ = local_1788._12_4_ ^ auVar18._12_4_;
      auVar28 = ZEXT1664(auVar26);
      auVar27 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar19);
      local_1748 = local_1748 + local_1748 * auVar21._0_4_;
      fStack_1744 = fStack_1744 + fStack_1744 * auVar21._4_4_;
      fStack_1740 = fStack_1740 + fStack_1740 * auVar21._8_4_;
      fStack_173c = fStack_173c + fStack_173c * auVar21._12_4_;
      auVar17._8_4_ = 0xff800000;
      auVar17._0_8_ = 0xff800000ff800000;
      auVar17._12_4_ = 0xff800000;
      auVar27 = vblendvps_avx(auVar17,auVar27,local_1788);
      auVar50 = ZEXT1664(auVar27);
      auVar20 = ZEXT1664(auVar26);
      local_1758 = local_1758 + local_1758 * auVar24._0_4_;
      fStack_1754 = fStack_1754 + fStack_1754 * auVar24._4_4_;
      fStack_1750 = fStack_1750 + fStack_1750 * auVar24._8_4_;
      fStack_174c = fStack_174c + fStack_174c * auVar24._12_4_;
      pNVar14 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar11 = &stack_near[2].field_0;
      stack_near[1].field_0 = local_1728;
      local_1768 = mm_lookupmask_ps._0_16_;
      do {
        paVar11 = paVar11 + -1;
        sVar13 = pNVar14[-1].ptr;
        pNVar14 = pNVar14 + -1;
        bVar16 = true;
        if (sVar13 != 0xfffffffffffffff8) {
          auVar17 = auVar20._0_16_;
          local_17f8 = *paVar11;
          local_1778 = auVar50._0_16_;
          auVar27 = vcmpps_avx((undefined1  [16])local_17f8,local_1778,1);
          if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar27[0xf] < '\0') {
LAB_00333c6c:
            uVar12 = (uint)sVar13;
            if ((sVar13 & 8) == 0) goto code_r0x00333c76;
            if (sVar13 == 0xfffffffffffffff8) goto LAB_00333e92;
            auVar27 = vcmpps_avx(local_1778,(undefined1  [16])local_17f8,6);
            if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar27[0xf] < '\0') {
              uVar9 = (ulong)(uVar12 & 0xf);
              auVar27 = vpcmpeqd_avx(auVar28._0_16_,auVar28._0_16_);
              auVar19 = auVar17;
              if (uVar9 != 8) {
                uVar8 = 1;
                auVar27 = auVar17 ^ auVar27;
                do {
                  local_17d0.geomID = *(uint *)(((sVar13 & 0xfffffffffffffff0) - 8) + uVar8 * 8);
                  local_17a0 = (context->scene->geometries).items[local_17d0.geomID].ptr;
                  uVar12 = local_17a0->mask;
                  auVar18._4_4_ = uVar12;
                  auVar18._0_4_ = uVar12;
                  auVar18._8_4_ = uVar12;
                  auVar18._12_4_ = uVar12;
                  auVar26 = vandps_avx(auVar18,*(undefined1 (*) [16])(ray + 0x90));
                  auVar19 = vpcmpeqd_avx(auVar26,(undefined1  [16])0x0);
                  auVar18 = auVar27 & ~auVar19;
                  auVar26 = local_1768;
                  if ((((auVar18 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar18 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar18 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar18[0xf] < '\0') {
                    mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                   vandnps_avx(auVar19,auVar27);
                    local_17d0.primID = *(uint *)(((sVar13 & 0xfffffffffffffff0) - 4) + uVar8 * 8);
                    local_17d0.valid = (int *)&mask;
                    local_17d0.geometryUserPtr = local_17a0->userPtr;
                    local_17d0.context = context->user;
                    local_17d0.N = 4;
                    local_1798 = 0;
                    local_1790 = context->args;
                    p_Var10 = local_1790->intersect;
                    if (p_Var10 == (RTCIntersectFunctionN)0x0) {
                      p_Var10 = (RTCIntersectFunctionN)
                                local_17a0[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i;
                    }
                    local_17d0.rayhit = (RTCRayHitN *)ray;
                    (*p_Var10)(&local_17d0);
                    auVar26 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),(undefined1  [16])0x0,1)
                    ;
                    auVar50 = ZEXT1664(local_1778);
                  }
                  auVar18 = vandnps_avx(auVar26,auVar27);
                  auVar27 = auVar27 & ~auVar26;
                } while (((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar27[0xf] < '\0') &&
                        (bVar16 = uVar8 < uVar9 - 8, uVar8 = uVar8 + 1, auVar27 = auVar18, bVar16));
                auVar27 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
                auVar19._0_4_ = auVar18._0_4_ ^ auVar27._0_4_;
                auVar19._4_4_ = auVar18._4_4_ ^ auVar27._4_4_;
                auVar19._8_4_ = auVar18._8_4_ ^ auVar27._8_4_;
                auVar19._12_4_ = auVar18._12_4_ ^ auVar27._12_4_;
              }
              bVar16 = true;
              auVar28 = ZEXT1664(auVar27);
              auVar17 = vpor_avx(auVar17,auVar19);
              auVar27 = auVar27 & ~auVar17;
              auVar20 = ZEXT1664(auVar17);
              if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar27[0xf] < '\0') {
                auVar27._8_4_ = 0xff800000;
                auVar27._0_8_ = 0xff800000ff800000;
                auVar27._12_4_ = 0xff800000;
                auVar27 = vblendvps_avx(auVar50._0_16_,auVar27,auVar17);
                auVar50 = ZEXT1664(auVar27);
                bVar16 = false;
              }
              goto LAB_00333e97;
            }
          }
LAB_00333e8f:
          bVar16 = false;
LAB_00333e92:
          auVar20 = ZEXT1664(auVar17);
        }
LAB_00333e97:
      } while (!bVar16);
      auVar27 = vandps_avx(auVar20._0_16_,local_1788);
      auVar22._8_4_ = 0xff800000;
      auVar22._0_8_ = 0xff800000ff800000;
      auVar22._12_4_ = 0xff800000;
      auVar27 = vmaskmovps_avx(auVar27,auVar22);
      *(undefined1 (*) [16])(ray + 0x80) = auVar27;
    }
  }
  return;
code_r0x00333c76:
  uVar8 = sVar13 & 0xfffffffffffffff0;
  auVar20 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
  uVar9 = 0;
  sVar13 = 8;
  do {
    sVar4 = *(size_t *)(uVar8 + uVar9 * 8);
    if (sVar4 != 8) {
      fVar1 = *(float *)(uVar8 + 0x80 + uVar9 * 4);
      fVar2 = *(float *)(uVar8 + 0x20 + uVar9 * 4);
      auVar27 = *(undefined1 (*) [16])(ray + 0x70);
      fVar23 = auVar27._0_4_;
      fVar29 = auVar27._4_4_;
      fVar30 = auVar27._8_4_;
      fVar31 = auVar27._12_4_;
      auVar32._0_4_ = fVar23 * fVar1 + fVar2;
      auVar32._4_4_ = fVar29 * fVar1 + fVar2;
      auVar32._8_4_ = fVar30 * fVar1 + fVar2;
      auVar32._12_4_ = fVar31 * fVar1 + fVar2;
      fVar1 = *(float *)(uVar8 + 0xa0 + uVar9 * 4);
      fVar2 = *(float *)(uVar8 + 0x40 + uVar9 * 4);
      auVar34._0_4_ = fVar23 * fVar1 + fVar2;
      auVar34._4_4_ = fVar29 * fVar1 + fVar2;
      auVar34._8_4_ = fVar30 * fVar1 + fVar2;
      auVar34._12_4_ = fVar31 * fVar1 + fVar2;
      fVar1 = *(float *)(uVar8 + 0xc0 + uVar9 * 4);
      fVar2 = *(float *)(uVar8 + 0x60 + uVar9 * 4);
      auVar38._0_4_ = fVar23 * fVar1 + fVar2;
      auVar38._4_4_ = fVar29 * fVar1 + fVar2;
      auVar38._8_4_ = fVar30 * fVar1 + fVar2;
      auVar38._12_4_ = fVar31 * fVar1 + fVar2;
      fVar1 = *(float *)(uVar8 + 0x90 + uVar9 * 4);
      fVar2 = *(float *)(uVar8 + 0x30 + uVar9 * 4);
      auVar41._0_4_ = fVar23 * fVar1 + fVar2;
      auVar41._4_4_ = fVar29 * fVar1 + fVar2;
      auVar41._8_4_ = fVar30 * fVar1 + fVar2;
      auVar41._12_4_ = fVar31 * fVar1 + fVar2;
      fVar1 = *(float *)(uVar8 + 0xb0 + uVar9 * 4);
      fVar2 = *(float *)(uVar8 + 0x50 + uVar9 * 4);
      auVar44._0_4_ = fVar2 + fVar23 * fVar1;
      auVar44._4_4_ = fVar2 + fVar29 * fVar1;
      auVar44._8_4_ = fVar2 + fVar30 * fVar1;
      auVar44._12_4_ = fVar2 + fVar31 * fVar1;
      fVar1 = *(float *)(uVar8 + 0xd0 + uVar9 * 4);
      fVar2 = *(float *)(uVar8 + 0x70 + uVar9 * 4);
      auVar47._0_4_ = fVar1 * fVar23 + fVar2;
      auVar47._4_4_ = fVar1 * fVar29 + fVar2;
      auVar47._8_4_ = fVar1 * fVar30 + fVar2;
      auVar47._12_4_ = fVar1 * fVar31 + fVar2;
      auVar7._8_8_ = uStack_16f0;
      auVar7._0_8_ = local_16f8;
      auVar26 = vsubps_avx(auVar32,auVar7);
      auVar49._0_4_ = local_1748 * auVar26._0_4_;
      auVar49._4_4_ = fStack_1744 * auVar26._4_4_;
      auVar49._8_4_ = fStack_1740 * auVar26._8_4_;
      auVar49._12_4_ = fStack_173c * auVar26._12_4_;
      auVar6._8_8_ = uStack_1700;
      auVar6._0_8_ = local_1708;
      auVar26 = vsubps_avx(auVar34,auVar6);
      auVar35._0_4_ = local_1738 * auVar26._0_4_;
      auVar35._4_4_ = fStack_1734 * auVar26._4_4_;
      auVar35._8_4_ = fStack_1730 * auVar26._8_4_;
      auVar35._12_4_ = fStack_172c * auVar26._12_4_;
      auVar5._8_8_ = uStack_1710;
      auVar5._0_8_ = local_1718;
      auVar26 = vsubps_avx(auVar38,auVar5);
      auVar39._0_4_ = local_1758 * auVar26._0_4_;
      auVar39._4_4_ = fStack_1754 * auVar26._4_4_;
      auVar39._8_4_ = fStack_1750 * auVar26._8_4_;
      auVar39._12_4_ = fStack_174c * auVar26._12_4_;
      auVar26 = vsubps_avx(auVar41,auVar7);
      auVar42._0_4_ = local_1748 * auVar26._0_4_;
      auVar42._4_4_ = fStack_1744 * auVar26._4_4_;
      auVar42._8_4_ = fStack_1740 * auVar26._8_4_;
      auVar42._12_4_ = fStack_173c * auVar26._12_4_;
      auVar26 = vsubps_avx(auVar44,auVar6);
      auVar45._0_4_ = local_1738 * auVar26._0_4_;
      auVar45._4_4_ = fStack_1734 * auVar26._4_4_;
      auVar45._8_4_ = fStack_1730 * auVar26._8_4_;
      auVar45._12_4_ = fStack_172c * auVar26._12_4_;
      auVar26 = vsubps_avx(auVar47,auVar5);
      auVar48._0_4_ = local_1758 * auVar26._0_4_;
      auVar48._4_4_ = fStack_1754 * auVar26._4_4_;
      auVar48._8_4_ = fStack_1750 * auVar26._8_4_;
      auVar48._12_4_ = fStack_174c * auVar26._12_4_;
      auVar26 = vpminsd_avx(auVar49,auVar42);
      auVar19 = vpminsd_avx(auVar35,auVar45);
      auVar26 = vpmaxsd_avx(auVar26,auVar19);
      auVar19 = vpminsd_avx(auVar39,auVar48);
      auVar26 = vpmaxsd_avx(auVar26,auVar19);
      auVar19 = vpmaxsd_avx(auVar49,auVar42);
      auVar18 = vpmaxsd_avx(auVar35,auVar45);
      auVar18 = vpminsd_avx(auVar19,auVar18);
      auVar19 = vpmaxsd_avx(auVar39,auVar48);
      auVar19 = vpminsd_avx(auVar19,local_1778);
      auVar18 = vpminsd_avx(auVar18,auVar19);
      auVar19 = vpmaxsd_avx(auVar26,(undefined1  [16])local_1728);
      if ((uVar12 & 7) == 6) {
        auVar19 = vcmpps_avx(auVar19,auVar18,2);
        uVar3 = *(undefined4 *)(uVar8 + 0xe0 + uVar9 * 4);
        auVar40._4_4_ = uVar3;
        auVar40._0_4_ = uVar3;
        auVar40._8_4_ = uVar3;
        auVar40._12_4_ = uVar3;
        auVar18 = vcmpps_avx(auVar40,auVar27,2);
        uVar3 = *(undefined4 *)(uVar8 + 0xf0 + uVar9 * 4);
        auVar43._4_4_ = uVar3;
        auVar43._0_4_ = uVar3;
        auVar43._8_4_ = uVar3;
        auVar43._12_4_ = uVar3;
        auVar27 = vcmpps_avx(auVar27,auVar43,1);
        auVar27 = vandps_avx(auVar18,auVar27);
        auVar27 = vandps_avx(auVar27,auVar19);
      }
      else {
        auVar27 = vcmpps_avx(auVar19,auVar18,2);
      }
      auVar19 = vcmpps_avx(local_1778,(undefined1  [16])local_17f8,6);
      auVar27 = vandps_avx(auVar27,auVar19);
      auVar27 = vpslld_avx(auVar27,0x1f);
      auVar28 = ZEXT1664(auVar27);
      if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar27[0xf] < '\0'
         ) {
        auVar36._8_4_ = 0x7f800000;
        auVar36._0_8_ = 0x7f8000007f800000;
        auVar36._12_4_ = 0x7f800000;
        auVar27 = vblendvps_avx(auVar36,auVar26,auVar27);
        auVar28 = ZEXT1664(auVar27);
        if (sVar13 != 8) {
          pNVar14->ptr = sVar13;
          pNVar14 = pNVar14 + 1;
          *paVar11 = auVar20._0_16_;
          paVar11 = paVar11 + 1;
        }
        auVar20 = ZEXT1664(auVar27);
        sVar13 = sVar4;
      }
    }
  } while ((sVar4 != 8) && (bVar15 = uVar9 < 3, uVar9 = uVar9 + 1, bVar15));
  local_17f8 = auVar20._0_16_;
  if (sVar13 == 8) goto LAB_00333e8f;
  goto LAB_00333c6c;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }